

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatCheckerboardTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatCheckerboardTexture *this)

{
  ulong uVar1;
  ulong uVar2;
  char *local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  uVar1 = (this->map2D).
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  local_80 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
    ::ToString_abi_cxx11_
              (&local_50,
               (TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                *)this);
    local_80 = local_50._M_dataplus._M_p;
  }
  uVar2 = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  local_58 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
              (&local_78,&(this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>);
    local_58 = local_78._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<char_const*,char_const*,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,
             "[ FloatCheckerboardTexture map2D: %s map3D: %s tex[0]: %s tex[1]: %s ",&local_80,
             &local_58,this->tex,this->tex + 1);
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (((uVar1 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatCheckerboardTexture::ToString() const {
    return StringPrintf("[ FloatCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s ",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1]);
}